

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_function.hpp
# Opt level: O3

void __thiscall duckdb::CopyFunction::CopyFunction(CopyFunction *this,string *name)

{
  pointer pcVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + name->_M_string_length);
  duckdb::Function::Function(&this->super_Function);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  *(undefined ***)this = &PTR__CopyFunction_0049a878;
  memset(&this->plan,0,0x90);
  duckdb::TableFunction::TableFunction(&this->copy_from_function);
  (this->extension)._M_dataplus._M_p = (pointer)&(this->extension).field_2;
  (this->extension)._M_string_length = 0;
  (this->extension).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit CopyFunction(const string &name)
	    : Function(name), plan(nullptr), copy_to_select(nullptr), copy_to_bind(nullptr),
	      copy_to_initialize_local(nullptr), copy_to_initialize_global(nullptr),
	      copy_to_get_written_statistics(nullptr), copy_to_sink(nullptr), copy_to_combine(nullptr),
	      copy_to_finalize(nullptr), execution_mode(nullptr), prepare_batch(nullptr), flush_batch(nullptr),
	      desired_batch_size(nullptr), rotate_files(nullptr), rotate_next_file(nullptr), serialize(nullptr),
	      deserialize(nullptr), copy_from_bind(nullptr) {
	}